

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O3

char * __thiscall
Memory::LargeHeapBucket::TryAllocFromExplicitFreeList
          (LargeHeapBucket *this,Recycler *recycler,size_t sizeCat,ObjectInfoBits attributes)

{
  int *piVar1;
  code *pcVar2;
  bool bVar3;
  uchar uVar4;
  byte bVar5;
  undefined4 *puVar6;
  LargeHeapBucket *pLVar7;
  LargeObjectHeader *pLVar8;
  size_t sVar9;
  Recycler *pRVar10;
  LargeHeapBlock *pLVar11;
  HeapBlock *pHVar12;
  LargeObjectHeader *extraout_RAX;
  Recycler *pRVar13;
  char *extraout_RAX_00;
  HeapInfo *extraout_RAX_01;
  HeapInfo *extraout_RAX_02;
  HeapInfo *extraout_RAX_03;
  HeapInfo *extraout_RAX_04;
  HeapInfo *pHVar14;
  uint uVar15;
  undefined6 in_register_0000000a;
  ulong extraout_RDX;
  ResetMarkFlags flags;
  Recycler *pRVar16;
  LargeHeapBucket *this_00;
  Recycler *this_01;
  LargeObjectHeader *pLStack_90;
  Recycler *pRStack_88;
  Recycler *pRStack_80;
  LargeHeapBucket *pLStack_78;
  LargeObjectHeader **ppLStack_70;
  LargeObjectHeader *pLStack_68;
  code *pcStack_60;
  LargeObjectHeader *local_50;
  LargeObjectHeader *dbgHeader;
  uint local_3c;
  LargeHeapBucket *local_38;
  undefined7 extraout_var;
  
  uVar15 = (uint)CONCAT62(in_register_0000000a,attributes);
  pRVar16 = recycler;
  local_38 = this;
  if (0x3ff < uVar15) {
    AssertCount = AssertCount + 1;
    pcStack_60 = (code *)0x6eea38;
    Js::Throw::LogAssert();
    pcStack_60 = (code *)0x6eea48;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    pRVar16 = (Recycler *)0x196;
    pcStack_60 = (code *)0x6eea70;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x196,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar3) {
LAB_006eed40:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pRVar13 = (Recycler *)local_38->explicitFreeList;
  if (pRVar13 != (Recycler *)0x0) {
    pcStack_60 = (code *)0x6eeaa7;
    dbgHeader = (LargeObjectHeader *)recycler;
    local_3c = uVar15;
    pLVar7 = (LargeHeapBucket *)__tls_get_addr(&PTR_01548f08);
    this_01 = (Recycler *)0x0;
    do {
      pcStack_60 = (code *)0x6eeab8;
      pLVar8 = LargeHeapBlock::GetHeaderFromAddress(pRVar13);
      if ((pLVar8->field_0x1a & 8) == 0) {
        AssertCount = AssertCount + 1;
        pcStack_60 = (code *)0x6eeacf;
        Js::Throw::LogAssert();
        *(undefined4 *)&(pLVar7->super_HeapBucket).heapInfo = 1;
        pRVar16 = (Recycler *)0x19e;
        pcStack_60 = (code *)0x6eeaf6;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                           ,0x19e,"(header->isExplicitFreed)","header->isExplicitFreed");
        if (!bVar3) goto LAB_006eed40;
        *(undefined4 *)&(pLVar7->super_HeapBucket).heapInfo = 0;
      }
      sVar9 = pLVar8->objectSize;
      if ((sVar9 + 0xff & 0xffffffffffffff00) != (ulong)(local_38->super_HeapBucket).sizeCat) {
        AssertCount = AssertCount + 1;
        pcStack_60 = (code *)0x6eeb32;
        Js::Throw::LogAssert();
        *(undefined4 *)&(pLVar7->super_HeapBucket).heapInfo = 1;
        pRVar16 = (Recycler *)0x19f;
        pcStack_60 = (code *)0x6eeb59;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                           ,0x19f,
                           "(HeapInfo::GetMediumObjectAlignedSizeNoCheck(header->objectSize) == this->sizeCat)"
                           ,
                           "HeapInfo::GetMediumObjectAlignedSizeNoCheck(header->objectSize) == this->sizeCat"
                          );
        if (!bVar3) goto LAB_006eed40;
        *(undefined4 *)&(pLVar7->super_HeapBucket).heapInfo = 0;
        sVar9 = pLVar8->objectSize;
      }
      if (sizeCat <= sVar9) {
        pLVar8->field_0x1a = pLVar8->field_0x1a & 0xf7;
        pcStack_60 = (code *)0x6eebaa;
        pRVar10 = (Recycler *)FreeObject::GetNext((FreeObject *)pRVar13);
        if (this_01 == (Recycler *)0x0) {
          local_38->explicitFreeList = (FreeObject *)pRVar10;
        }
        else {
          pcStack_60 = (code *)0x6eebba;
          FreeObject::SetNext((FreeObject *)this_01,(FreeObject *)pRVar10);
          pRVar16 = pRVar10;
        }
        if (((Recycler *)0xffff < pRVar13) && (((ulong)pRVar13 & 0xf) == 0)) {
          sizeCat = (size_t)&dbgHeader[1].next;
          pcStack_60 = (code *)0x6eebef;
          pRVar16 = pRVar13;
          pLVar11 = (LargeHeapBlock *)
                    HeapBlockMap64::GetHeapBlock((HeapBlockMap64 *)sizeCat,pRVar13);
          if (pLVar11 != (LargeHeapBlock *)0x0) {
            if ((pLVar11->super_HeapBlock).heapBlockType != LargeBlockType) {
              AssertCount = AssertCount + 1;
              pcStack_60 = (code *)0x6eec0f;
              Js::Throw::LogAssert();
              *(undefined4 *)&(pLVar7->super_HeapBucket).heapInfo = 1;
              pcStack_60 = (code *)0x6eec36;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                                 ,0x1b4,"(heapBlockVerify->IsLargeHeapBlock())",
                                 "heapBlockVerify->IsLargeHeapBlock()");
              if (!bVar3) goto LAB_006eed40;
              *(undefined4 *)&(pLVar7->super_HeapBucket).heapInfo = 0;
            }
            pcStack_60 = (code *)0x6eec55;
            bVar3 = LargeHeapBlock::GetObjectHeader(pLVar11,pRVar13,&local_50);
            if (!bVar3) {
              AssertCount = AssertCount + 1;
              pcStack_60 = (code *)0x6eec67;
              Js::Throw::LogAssert();
              *(undefined4 *)&(pLVar7->super_HeapBucket).heapInfo = 1;
              pcStack_60 = (code *)0x6eec8e;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                                 ,0x1b7,"(largeHeapBlock->GetObjectHeader(memBlock, &dbgHeader))",
                                 "largeHeapBlock->GetObjectHeader(memBlock, &dbgHeader)");
              if (!bVar3) goto LAB_006eed40;
              *(undefined4 *)&(pLVar7->super_HeapBucket).heapInfo = 0;
            }
            if (local_50 != pLVar8) {
              AssertCount = AssertCount + 1;
              pcStack_60 = (code *)0x6eecb2;
              Js::Throw::LogAssert();
              *(undefined4 *)&(pLVar7->super_HeapBucket).heapInfo = 1;
              pcStack_60 = (code *)0x6eecd9;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                                 ,0x1b8,"(dbgHeader == header)","dbgHeader == header");
              if (!bVar3) goto LAB_006eed40;
              *(undefined4 *)&(pLVar7->super_HeapBucket).heapInfo = 0;
            }
            *(undefined8 *)pRVar13 = 0;
            pcStack_60 = (code *)0x6eed02;
            uVar4 = (uchar)local_3c;
            LargeObjectHeader::SetAttributes(pLVar8,dbgHeader->objectIndex,uVar4);
            if (-1 < (char)uVar4) {
              return (char *)pRVar13;
            }
            pcStack_60 = (code *)0x6eed16;
            pHVar12 = HeapBlockMap64::GetHeapBlock((HeapBlockMap64 *)sizeCat,pRVar13);
            piVar1 = (int *)((long)&pHVar12[4].address + 4);
            *piVar1 = *piVar1 + 1;
            pHVar14 = (local_38->super_HeapBucket).heapInfo;
            pHVar14->liveFinalizableObjectCount = pHVar14->liveFinalizableObjectCount + 1;
            pHVar14->newFinalizableObjectCount = pHVar14->newFinalizableObjectCount + 1;
            return (char *)pRVar13;
          }
        }
        pcStack_60 = ExplicitFree;
        this_00 = pLVar7;
        TryAllocFromExplicitFreeList(pLVar7);
        pLStack_90 = extraout_RAX;
        pRStack_88 = pRVar13;
        pRStack_80 = this_01;
        pLStack_78 = pLVar7;
        ppLStack_70 = (LargeObjectHeader **)sizeCat;
        pLStack_68 = pLVar8;
        pcStack_60 = (code *)&stack0xfffffffffffffff8;
        if ((extraout_RDX + 0xff & 0xffffffffffffff00) != (ulong)(this_00->super_HeapBucket).sizeCat
           ) {
          AssertCount = AssertCount + 1;
          pcStack_60 = (code *)&stack0xfffffffffffffff8;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                             ,0x1d7,
                             "(HeapInfo::GetMediumObjectAlignedSizeNoCheck(sizeCat) == this->sizeCat)"
                             ,
                             "HeapInfo::GetMediumObjectAlignedSizeNoCheck(sizeCat) == this->sizeCat"
                            );
          if (!bVar3) goto LAB_006ef0a5;
          *puVar6 = 0;
        }
        pLVar8 = LargeHeapBlock::GetHeaderFromAddress(pRVar16);
        flags = ((this_00->super_HeapBucket).heapInfo)->recycler->Cookie;
        uVar4 = LargeObjectHeader::GetAttributes(pLVar8,flags);
        if (uVar4 != '\0') {
          flags = ((this_00->super_HeapBucket).heapInfo)->recycler->Cookie;
          uVar4 = LargeObjectHeader::GetAttributes(pLVar8,flags);
          if (uVar4 != ' ') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            flags = 0x1d9;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                               ,0x1d9,
                               "(header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::NoBit || header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::LeafBit)"
                               ,
                               "header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::NoBit || header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::LeafBit"
                              );
            if (!bVar3) goto LAB_006ef0a5;
            *puVar6 = 0;
          }
        }
        bVar5 = pLVar8->field_0x1a;
        if ((bVar5 & 8) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          flags = 0x1da;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                             ,0x1da,"(!header->isExplicitFreed)","!header->isExplicitFreed");
          if (!bVar3) goto LAB_006ef0a5;
          *puVar6 = 0;
          bVar5 = pLVar8->field_0x1a;
        }
        pLVar8->field_0x1a = bVar5 | 8;
        if (pLVar8->objectSize < extraout_RDX) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          flags = 0x1dc;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                             ,0x1dc,"(header->objectSize >= sizeCat)",
                             "header->objectSize >= sizeCat");
          if (!bVar3) goto LAB_006ef0a5;
          *puVar6 = 0;
        }
        pLVar7 = this_00;
        pRVar13 = HeapBucket::GetRecycler(&this_00->super_HeapBucket);
        if ((pRVar16 < (Recycler *)0x10000) || (((ulong)pRVar16 & 0xf) != 0)) {
LAB_006ef0a7:
          ExplicitFree();
          pHVar14 = (pLVar7->super_HeapBucket).heapInfo;
          pRVar16 = pHVar14->recycler;
          for (pLVar11 = pLVar7->largeBlockList; pLVar11 != (LargeHeapBlock *)0x0;
              pLVar11 = pLVar11->next) {
            LargeHeapBlock::ResetMarks(pLVar11,flags,pRVar16);
            pHVar14 = extraout_RAX_01;
          }
          for (pLVar11 = pLVar7->largePageHeapBlockList; pLVar11 != (LargeHeapBlock *)0x0;
              pLVar11 = pLVar11->next) {
            LargeHeapBlock::ResetMarks(pLVar11,flags,pRVar16);
            pHVar14 = extraout_RAX_02;
          }
          for (pLVar11 = pLVar7->fullLargeBlockList; pLVar11 != (LargeHeapBlock *)0x0;
              pLVar11 = pLVar11->next) {
            LargeHeapBlock::ResetMarks(pLVar11,flags,pRVar16);
            pHVar14 = extraout_RAX_03;
          }
          for (pLVar11 = pLVar7->pendingDisposeLargeBlockList; pLVar11 != (LargeHeapBlock *)0x0;
              pLVar11 = pLVar11->next) {
            LargeHeapBlock::ResetMarks(pLVar11,flags,pRVar16);
            pHVar14 = extraout_RAX_04;
          }
          if (pLVar7->pendingSweepLargeBlockList != (LargeHeapBlock *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                               ,0x20c,"(pendingSweepLargeBlockList == nullptr)",
                               "pendingSweepLargeBlockList == nullptr");
            pHVar14 = (HeapInfo *)CONCAT71(extraout_var,bVar3);
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar6 = 0;
          }
          return (char *)pHVar14;
        }
        pLVar7 = (LargeHeapBucket *)&pRVar13->heapBlockMap;
        pRVar13 = pRVar16;
        pLVar11 = (LargeHeapBlock *)HeapBlockMap64::GetHeapBlock((HeapBlockMap64 *)pLVar7,pRVar16);
        flags = (ResetMarkFlags)pRVar13;
        if (pLVar11 == (LargeHeapBlock *)0x0) goto LAB_006ef0a7;
        if ((pLVar11->super_HeapBlock).heapBlockType != LargeBlockType) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                             ,0x1e1,"(heapBlock->IsLargeHeapBlock())",
                             "heapBlock->IsLargeHeapBlock()");
          if (!bVar3) goto LAB_006ef0a5;
          *puVar6 = 0;
        }
        bVar3 = LargeHeapBlock::GetObjectHeader(pLVar11,pRVar16,&pLStack_90);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                             ,0x1e5,"(largeHeapBlock->GetObjectHeader(object, &dbgHeader))",
                             "largeHeapBlock->GetObjectHeader(object, &dbgHeader)");
          if (!bVar3) goto LAB_006ef0a5;
          *puVar6 = 0;
        }
        if (pLStack_90 != pLVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                             ,0x1e6,"(dbgHeader == header)","dbgHeader == header");
          if (!bVar3) {
LAB_006ef0a5:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
        FreeObject::SetNext((FreeObject *)pRVar16,this_00->explicitFreeList);
        this_00->explicitFreeList = (FreeObject *)pRVar16;
        LargeObjectHeader::SetAttributes
                  (pLVar8,((this_00->super_HeapBucket).heapInfo)->recycler->Cookie,' ');
        return extraout_RAX_00;
      }
      pcStack_60 = (code *)0x6eeb7a;
      pRVar10 = (Recycler *)FreeObject::GetNext((FreeObject *)pRVar13);
      this_01 = pRVar13;
      pRVar13 = pRVar10;
    } while (pRVar10 != (Recycler *)0x0);
  }
  return (char *)0x0;
}

Assistant:

char *
LargeHeapBucket::TryAllocFromExplicitFreeList(Recycler * recycler, size_t sizeCat, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    FreeObject * currFreeObject = this->explicitFreeList;
    FreeObject * prevFreeObject = nullptr;
    while (currFreeObject != nullptr)
    {
        char * memBlock = (char *)currFreeObject;
        LargeObjectHeader * header = LargeHeapBlock::GetHeaderFromAddress(memBlock);
        Assert(header->isExplicitFreed);
        Assert(HeapInfo::GetMediumObjectAlignedSizeNoCheck(header->objectSize) == this->sizeCat);
        if (header->objectSize < sizeCat)
        {
            prevFreeObject = currFreeObject;
            currFreeObject = currFreeObject->GetNext();
            continue;
        }

        DebugOnly(header->isExplicitFreed = false);
        if (prevFreeObject)
        {
            prevFreeObject->SetNext(currFreeObject->GetNext());
        }
        else
        {
            this->explicitFreeList = currFreeObject->GetNext();
        }

#ifdef RECYCLER_MEMORY_VERIFY
        HeapBlock* heapBlockVerify = recycler->FindHeapBlock(memBlock);
        Assert(heapBlockVerify != nullptr);
        Assert(heapBlockVerify->IsLargeHeapBlock());
        LargeHeapBlock * largeHeapBlock = (LargeHeapBlock *)heapBlockVerify;
        LargeObjectHeader * dbgHeader;
        Assert(largeHeapBlock->GetObjectHeader(memBlock, &dbgHeader));
        Assert(dbgHeader == header);

        ((FreeObject *)memBlock)->DebugFillNext();
#endif
#ifdef RECYCLER_ZERO_MEM_CHECK
        // TODO: large heap block doesn't separate leaf object on to different page allocator.
        // so all the memory should still be zeroed.
        memset(memBlock, 0, sizeof(FreeObject));
#endif
        header->SetAttributes(recycler->Cookie, (attributes & StoredObjectInfoBitMask));

        if ((attributes & ObjectInfoBits::FinalizeBit) != 0)
        {
            LargeHeapBlock* heapBlock = (LargeHeapBlock *)recycler->FindHeapBlock(memBlock);
            heapBlock->finalizeCount++;
#ifdef RECYCLER_FINALIZE_CHECK
            heapInfo->liveFinalizableObjectCount++;
            heapInfo->newFinalizableObjectCount++;
#endif
        }
        return memBlock;
    }

    return nullptr;
}